

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O1

int read_markers(j_decompress_ptr cinfo)

{
  byte bVar1;
  byte bVar2;
  JOCTET JVar3;
  JOCTET JVar4;
  byte bVar5;
  jpeg_source_mgr *pjVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  boolean bVar25;
  int iVar26;
  uint uVar27;
  JHUFF_TBL *pJVar28;
  JQUANT_TBL *pJVar29;
  jpeg_error_mgr *pjVar30;
  JHUFF_TBL **ppJVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  boolean is_prog;
  byte *pbVar36;
  JOCTET *pJVar37;
  long lVar38;
  byte *pbVar39;
  UINT16 UVar40;
  size_t sVar41;
  jpeg_component_info *pjVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  UINT8 bits [17];
  size_t local_190;
  byte local_168;
  uint uStack_167;
  undefined3 uStack_163;
  undefined1 uStack_160;
  uint uStack_15f;
  undefined3 uStack_15b;
  UINT8 UStack_158;
  JHUFF_TBL **local_150;
  JHUFF_TBL **local_148;
  UINT8 *local_140;
  byte local_138 [264];
  
  local_148 = cinfo->ac_huff_tbl_ptrs;
  local_150 = cinfo->dc_huff_tbl_ptrs;
  local_140 = cinfo->arith_ac_K;
  do {
    if (cinfo->unread_marker == 0) {
      if (cinfo->marker->saw_SOI == 0) {
        pjVar6 = cinfo->src;
        sVar41 = pjVar6->bytes_in_buffer;
        if (sVar41 == 0) {
          bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
          if (bVar25 == 0) goto LAB_00120c43;
          sVar41 = pjVar6->bytes_in_buffer;
        }
        bVar1 = *pjVar6->next_input_byte;
        sVar41 = sVar41 - 1;
        if (sVar41 == 0) {
          bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
          if (bVar25 == 0) goto LAB_00120c43;
          pbVar36 = pjVar6->next_input_byte;
          sVar41 = pjVar6->bytes_in_buffer;
        }
        else {
          pbVar36 = pjVar6->next_input_byte + 1;
        }
        bVar2 = *pbVar36;
        if (bVar2 != 0xd8 || bVar1 != 0xff) {
          pjVar30 = cinfo->err;
          pjVar30->msg_code = 0x35;
          *(uint *)&pjVar30->msg_parm = (uint)bVar1;
          *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)bVar2;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        cinfo->unread_marker = (uint)bVar2;
        pjVar6->next_input_byte = pbVar36 + 1;
        pjVar6->bytes_in_buffer = sVar41 - 1;
      }
      else {
        bVar25 = next_marker(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
      }
    }
    iVar26 = cinfo->unread_marker;
    switch(iVar26) {
    case 0xc0:
    case 0xc1:
      is_prog = 0;
      goto LAB_0011ffab;
    case 0xc2:
      is_prog = 1;
LAB_0011ffab:
      bVar25 = 0;
LAB_00120103:
      bVar25 = get_sof(cinfo,is_prog,bVar25);
      if (bVar25 == 0) {
        return 0;
      }
      break;
    case 0xc3:
    case 0xc5:
    case 0xc6:
    case 199:
    case 200:
    case 0xcb:
    case 0xcd:
    case 0xce:
    case 0xcf:
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x3c;
      goto LAB_0011ff18;
    case 0xc4:
      pjVar6 = cinfo->src;
      sVar41 = pjVar6->bytes_in_buffer;
      if (sVar41 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        sVar41 = pjVar6->bytes_in_buffer;
      }
      bVar1 = *pjVar6->next_input_byte;
      sVar41 = sVar41 - 1;
      if (sVar41 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        pbVar36 = pjVar6->next_input_byte;
        sVar41 = pjVar6->bytes_in_buffer;
      }
      else {
        pbVar36 = pjVar6->next_input_byte + 1;
      }
      uVar34 = (ulong)bVar1 * 0x100;
      sVar41 = sVar41 - 1;
      pbVar39 = pbVar36 + 1;
      local_190 = *pbVar36 + uVar34 + -2;
      if (0x12 < (uVar34 | *pbVar36)) {
        do {
          if (sVar41 == 0) {
            bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
            if (bVar25 == 0) goto LAB_00120c43;
            pbVar39 = pjVar6->next_input_byte;
            sVar41 = pjVar6->bytes_in_buffer;
          }
          bVar1 = *pbVar39;
          pjVar30 = cinfo->err;
          pjVar30->msg_code = 0x50;
          uVar33 = (uint)bVar1;
          (pjVar30->msg_parm).i[0] = uVar33;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          local_168 = 0;
          pbVar39 = pbVar39 + 1;
          sVar41 = sVar41 - 1;
          uVar27 = 0;
          lVar38 = 1;
          do {
            if (sVar41 == 0) {
              bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
              if (bVar25 == 0) goto LAB_00120c43;
              pbVar39 = pjVar6->next_input_byte;
              sVar41 = pjVar6->bytes_in_buffer;
            }
            bVar2 = *pbVar39;
            (&local_168)[lVar38] = bVar2;
            uVar27 = uVar27 + bVar2;
            lVar38 = lVar38 + 1;
            pbVar39 = pbVar39 + 1;
            sVar41 = sVar41 - 1;
          } while (lVar38 != 0x11);
          pjVar30 = cinfo->err;
          auVar11[0xc] = (char)(uStack_167 >> 0x18);
          auVar11._0_12_ = ZEXT712(0);
          auVar23[1] = 0;
          auVar23[0] = (byte)(uStack_167 >> 0x10);
          auVar23._2_3_ = auVar11._10_3_;
          auVar23._5_8_ = 0;
          auVar43[5] = 0;
          auVar43[4] = (byte)(uStack_167 >> 8);
          auVar43._6_7_ = SUB137(auVar23 << 0x40,6);
          auVar43._0_4_ = uStack_167 & 0xff;
          auVar43._13_3_ = 0;
          *(undefined1 (*) [16])&pjVar30->msg_parm = auVar43;
          uVar34 = (ulong)(ushort)_uStack_163 & 0xffffffffffff00ff;
          auVar12._8_4_ = 0;
          auVar12._0_8_ = uVar34;
          auVar12[0xc] = (char)((uint)_uStack_163 >> 0x18);
          auVar13[8] = (char)((uint)_uStack_163 >> 0x10);
          auVar13._0_8_ = uVar34;
          auVar13[9] = 0;
          auVar13._10_3_ = auVar12._10_3_;
          auVar19._5_8_ = 0;
          auVar19._0_5_ = auVar13._8_5_;
          auVar44._0_4_ = (undefined4)uVar34;
          auVar14[4] = (char)((uint)_uStack_163 >> 8);
          auVar14._0_4_ = auVar44._0_4_;
          auVar14[5] = 0;
          auVar14._6_7_ = SUB137(auVar19 << 0x40,6);
          auVar44._4_9_ = auVar14._4_9_;
          auVar44._13_3_ = 0;
          *(undefined1 (*) [16])((long)&pjVar30->msg_parm + 0x10) = auVar44;
          pjVar30->msg_code = 0x56;
          (*pjVar30->emit_message)((j_common_ptr)cinfo,2);
          pjVar30 = cinfo->err;
          auVar15[0xc] = (char)(uStack_15f >> 0x18);
          auVar15._0_12_ = ZEXT712(0);
          auVar24[1] = 0;
          auVar24[0] = (byte)(uStack_15f >> 0x10);
          auVar24._2_3_ = auVar15._10_3_;
          auVar24._5_8_ = 0;
          auVar45[5] = 0;
          auVar45[4] = (byte)(uStack_15f >> 8);
          auVar45._6_7_ = SUB137(auVar24 << 0x40,6);
          auVar45._0_4_ = uStack_15f & 0xff;
          auVar45._13_3_ = 0;
          *(undefined1 (*) [16])&pjVar30->msg_parm = auVar45;
          uVar34 = (ulong)(ushort)_uStack_15b & 0xffffffffffff00ff;
          auVar16._8_4_ = 0;
          auVar16._0_8_ = uVar34;
          auVar16[0xc] = (char)((uint)_uStack_15b >> 0x18);
          auVar17[8] = (char)((uint)_uStack_15b >> 0x10);
          auVar17._0_8_ = uVar34;
          auVar17[9] = 0;
          auVar17._10_3_ = auVar16._10_3_;
          auVar20._5_8_ = 0;
          auVar20._0_5_ = auVar17._8_5_;
          auVar46._0_4_ = (undefined4)uVar34;
          auVar18[4] = (char)((uint)_uStack_15b >> 8);
          auVar18._0_4_ = auVar46._0_4_;
          auVar18[5] = 0;
          auVar18._6_7_ = SUB137(auVar20 << 0x40,6);
          auVar46._4_9_ = auVar18._4_9_;
          auVar46._13_3_ = 0;
          *(undefined1 (*) [16])((long)&pjVar30->msg_parm + 0x10) = auVar46;
          pjVar30->msg_code = 0x56;
          (*pjVar30->emit_message)((j_common_ptr)cinfo,2);
          uVar34 = (ulong)uVar27;
          if ((0x100 < uVar27) || ((long)(local_190 + -0x11) < (long)uVar34)) {
            pjVar30 = cinfo->err;
            pjVar30->msg_code = 8;
            (*pjVar30->error_exit)((j_common_ptr)cinfo);
          }
          if (uVar27 != 0) {
            uVar32 = 0;
            do {
              if (sVar41 == 0) {
                bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
                if (bVar25 == 0) goto LAB_00120c43;
                pbVar39 = pjVar6->next_input_byte;
                sVar41 = pjVar6->bytes_in_buffer;
              }
              sVar41 = sVar41 - 1;
              bVar2 = *pbVar39;
              pbVar39 = pbVar39 + 1;
              local_138[uVar32] = bVar2;
              uVar32 = uVar32 + 1;
            } while (uVar34 != uVar32);
          }
          memset(local_138 + uVar34,0,(long)(int)(0x100 - uVar27));
          if ((bVar1 & 0x10) == 0) {
            ppJVar31 = local_150;
            if (3 < bVar1) {
              pjVar30 = cinfo->err;
              pjVar30->msg_code = 0x1e;
              (pjVar30->msg_parm).i[0] = uVar33;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
              ppJVar31 = local_150;
            }
          }
          else {
            uVar33 = uVar33 - 0x10;
            ppJVar31 = local_148;
            if (0x13 < bVar1) {
              pjVar30 = cinfo->err;
              pjVar30->msg_code = 0x1e;
              (pjVar30->msg_parm).i[0] = uVar33;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
              ppJVar31 = local_148;
            }
          }
          ppJVar31 = ppJVar31 + uVar33;
          if (*ppJVar31 == (JHUFF_TBL *)0x0) {
            pJVar28 = jpeg_alloc_huff_table((j_common_ptr)cinfo);
            *ppJVar31 = pJVar28;
          }
          local_190 = (local_190 + -0x11) - uVar34;
          pJVar28 = *ppJVar31;
          pJVar28->bits[0x10] = UStack_158;
          *(ulong *)pJVar28->bits = CONCAT35(uStack_163,CONCAT41(uStack_167,local_168));
          *(ulong *)(pJVar28->bits + 8) = CONCAT35(uStack_15b,CONCAT41(uStack_15f,uStack_160));
          memcpy((*ppJVar31)->huffval,local_138,0x100);
        } while (0x10 < (long)local_190);
      }
      if (local_190 != 0) {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0xb;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
      }
      pjVar6->next_input_byte = pbVar39;
      pjVar6->bytes_in_buffer = sVar41;
      break;
    case 0xc9:
      is_prog = 0;
      bVar25 = 1;
      goto LAB_00120103;
    case 0xca:
      iVar26 = get_sof(cinfo,1,1);
      goto LAB_0011ff01;
    case 0xcc:
      pjVar6 = cinfo->src;
      sVar41 = pjVar6->bytes_in_buffer;
      if (sVar41 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        sVar41 = pjVar6->bytes_in_buffer;
      }
      bVar1 = *pjVar6->next_input_byte;
      sVar41 = sVar41 - 1;
      if (sVar41 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        pbVar36 = pjVar6->next_input_byte;
        sVar41 = pjVar6->bytes_in_buffer;
      }
      else {
        pbVar36 = pjVar6->next_input_byte + 1;
      }
      uVar32 = (ulong)bVar1 * 0x100;
      uVar34 = uVar32 | *pbVar36;
      pbVar39 = pbVar36 + 1;
      sVar41 = sVar41 - 1;
      if (uVar34 < 3) {
        lVar38 = uVar32 + *pbVar36 + -2;
      }
      else {
        do {
          uVar32 = uVar34;
          if (sVar41 == 0) {
            bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
            if (bVar25 == 0) goto LAB_00120c43;
            pbVar39 = pjVar6->next_input_byte;
            sVar41 = pjVar6->bytes_in_buffer;
          }
          bVar1 = *pbVar39;
          sVar41 = sVar41 - 1;
          if (sVar41 == 0) {
            bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
            if (bVar25 == 0) goto LAB_00120c43;
            pbVar39 = pjVar6->next_input_byte;
            sVar41 = pjVar6->bytes_in_buffer;
          }
          else {
            pbVar39 = pbVar39 + 1;
          }
          bVar2 = *pbVar39;
          pjVar30 = cinfo->err;
          pjVar30->msg_code = 0x4f;
          (pjVar30->msg_parm).i[0] = (uint)bVar1;
          (cinfo->err->msg_parm).i[1] = (uint)bVar2;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          if (0x1f < bVar1) {
            pjVar30 = cinfo->err;
            pjVar30->msg_code = 0x1c;
            (pjVar30->msg_parm).i[0] = (uint)bVar1;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          uVar33 = (uint)bVar1;
          if (bVar1 < 0x10) {
            cinfo->arith_dc_L[uVar33] = bVar2 & 0xf;
            cinfo->arith_dc_U[uVar33] = bVar2 >> 4;
            if (bVar2 >> 4 < (bVar2 & 0xf)) {
              pjVar30 = cinfo->err;
              pjVar30->msg_code = 0x1d;
              (pjVar30->msg_parm).i[0] = (uint)bVar2;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
          }
          else {
            cinfo->arith_ac_K[uVar33 - 0x10] = bVar2;
          }
          pbVar39 = pbVar39 + 1;
          sVar41 = sVar41 - 1;
          uVar34 = uVar32 - 2;
        } while (2 < (long)uVar34);
        lVar38 = uVar32 - 4;
      }
      if (lVar38 != 0) {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0xb;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
      }
      pjVar6->next_input_byte = pbVar39;
      pjVar6->bytes_in_buffer = sVar41;
      break;
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
      goto switchD_0011feec_caseD_d0;
    case 0xd8:
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x66;
      (*pjVar30->emit_message)((j_common_ptr)cinfo,1);
      if (cinfo->marker->saw_SOI != 0) {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0x3d;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
      }
      cinfo->arith_dc_L[0] = '\0';
      cinfo->arith_dc_L[1] = '\0';
      cinfo->arith_dc_L[2] = '\0';
      cinfo->arith_dc_L[3] = '\0';
      cinfo->arith_dc_L[4] = '\0';
      cinfo->arith_dc_L[5] = '\0';
      cinfo->arith_dc_L[6] = '\0';
      cinfo->arith_dc_L[7] = '\0';
      cinfo->arith_dc_L[8] = '\0';
      cinfo->arith_dc_L[9] = '\0';
      cinfo->arith_dc_L[10] = '\0';
      cinfo->arith_dc_L[0xb] = '\0';
      cinfo->arith_dc_L[0xc] = '\0';
      cinfo->arith_dc_L[0xd] = '\0';
      cinfo->arith_dc_L[0xe] = '\0';
      cinfo->arith_dc_L[0xf] = '\0';
      builtin_memcpy(cinfo->arith_dc_U,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
      builtin_memcpy(local_140,"\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05",
                     0x10);
      cinfo->restart_interval = 0;
      cinfo->saw_JFIF_marker = 0;
      cinfo->jpeg_color_space = JCS_UNKNOWN;
      cinfo->CCIR601_sampling = 0;
      cinfo->JFIF_major_version = '\x01';
      cinfo->JFIF_minor_version = '\x01';
      cinfo->density_unit = '\0';
      cinfo->X_density = 1;
      cinfo->Y_density = 1;
      cinfo->saw_Adobe_marker = 0;
      cinfo->Adobe_transform = '\0';
      cinfo->marker->saw_SOI = 1;
      break;
    case 0xd9:
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x55;
      (*pjVar30->emit_message)((j_common_ptr)cinfo,1);
      cinfo->unread_marker = 0;
      return 2;
    case 0xda:
      pjVar6 = cinfo->src;
      pJVar37 = pjVar6->next_input_byte;
      local_190 = pjVar6->bytes_in_buffer;
      if (cinfo->marker->saw_SOF == 0) {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0x3e;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
      }
      if (local_190 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        pJVar37 = pjVar6->next_input_byte;
        local_190 = pjVar6->bytes_in_buffer;
      }
      JVar3 = *pJVar37;
      local_190 = local_190 - 1;
      if (local_190 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        pJVar37 = pjVar6->next_input_byte;
        local_190 = pjVar6->bytes_in_buffer;
      }
      else {
        pJVar37 = pJVar37 + 1;
      }
      JVar4 = *pJVar37;
      local_190 = local_190 - 1;
      if (local_190 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        pbVar36 = pjVar6->next_input_byte;
        local_190 = pjVar6->bytes_in_buffer;
      }
      else {
        pbVar36 = pJVar37 + 1;
      }
      bVar1 = *pbVar36;
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x67;
      (pjVar30->msg_parm).i[0] = (uint)bVar1;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      if ((CONCAT11(JVar3,JVar4) != (ushort)((ushort)bVar1 * 2 + 6)) || ((byte)(bVar1 - 5) < 0xfc))
      {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0xb;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
      }
      cinfo->comps_in_scan = (uint)bVar1;
      cinfo->cur_comp_info[0] = (jpeg_component_info *)0x0;
      cinfo->cur_comp_info[1] = (jpeg_component_info *)0x0;
      cinfo->cur_comp_info[2] = (jpeg_component_info *)0x0;
      cinfo->cur_comp_info[3] = (jpeg_component_info *)0x0;
      pbVar36 = pbVar36 + 1;
      local_190 = local_190 - 1;
      if (bVar1 == 0) goto LAB_00120b43;
      uVar34 = 0;
      goto LAB_00120a01;
    case 0xdb:
      pjVar6 = cinfo->src;
      sVar41 = pjVar6->bytes_in_buffer;
      if (sVar41 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        sVar41 = pjVar6->bytes_in_buffer;
      }
      bVar1 = *pjVar6->next_input_byte;
      sVar41 = sVar41 - 1;
      if (sVar41 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        pbVar36 = pjVar6->next_input_byte;
        sVar41 = pjVar6->bytes_in_buffer;
      }
      else {
        pbVar36 = pjVar6->next_input_byte + 1;
      }
      uVar34 = (ulong)bVar1 * 0x100;
      sVar41 = sVar41 - 1;
      pbVar39 = pbVar36 + 1;
      lVar38 = uVar34 + *pbVar36 + -2;
      if (2 < (uVar34 | *pbVar36)) {
        do {
          if (sVar41 == 0) {
            bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
            if (bVar25 == 0) goto LAB_00120c43;
            pbVar39 = pjVar6->next_input_byte;
            sVar41 = pjVar6->bytes_in_buffer;
          }
          bVar1 = *pbVar39;
          uVar33 = bVar1 & 0xf;
          pjVar30 = cinfo->err;
          pjVar30->msg_code = 0x51;
          (pjVar30->msg_parm).i[0] = uVar33;
          *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)(bVar1 >> 4);
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          if (3 < uVar33) {
            pjVar30 = cinfo->err;
            pjVar30->msg_code = 0x1f;
            (pjVar30->msg_parm).i[0] = uVar33;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if (cinfo->quant_tbl_ptrs[uVar33] == (JQUANT_TBL *)0x0) {
            pJVar29 = jpeg_alloc_quant_table((j_common_ptr)cinfo);
            cinfo->quant_tbl_ptrs[uVar33] = pJVar29;
          }
          pJVar29 = cinfo->quant_tbl_ptrs[uVar33];
          sVar41 = sVar41 - 1;
          pbVar39 = pbVar39 + 1;
          lVar35 = 0;
          do {
            if (bVar1 < 0x10) {
              if (sVar41 == 0) {
                bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
                if (bVar25 == 0) goto LAB_00120c43;
                pbVar39 = pjVar6->next_input_byte;
                sVar41 = pjVar6->bytes_in_buffer;
              }
              UVar40 = (UINT16)*pbVar39;
            }
            else {
              if (sVar41 == 0) {
                bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
                if (bVar25 == 0) goto LAB_00120c43;
                pbVar39 = pjVar6->next_input_byte;
                sVar41 = pjVar6->bytes_in_buffer;
              }
              bVar2 = *pbVar39;
              sVar41 = sVar41 - 1;
              if (sVar41 == 0) {
                bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
                if (bVar25 == 0) goto LAB_00120c43;
                pbVar39 = pjVar6->next_input_byte;
                sVar41 = pjVar6->bytes_in_buffer;
              }
              else {
                pbVar39 = pbVar39 + 1;
              }
              UVar40 = CONCAT11(bVar2,*pbVar39);
            }
            pJVar29->quantval[jpeg_natural_order[lVar35]] = UVar40;
            lVar35 = lVar35 + 1;
            sVar41 = sVar41 - 1;
            pbVar39 = pbVar39 + 1;
          } while (lVar35 != 0x40);
          if (1 < cinfo->err->trace_level) {
            uVar34 = 0xfffffffffffffff8;
            do {
              pjVar30 = cinfo->err;
              uVar32 = *(ulong *)(pJVar29->quantval + uVar34 + 8);
              auVar8._8_4_ = 0;
              auVar8._0_8_ = uVar32;
              auVar8._12_2_ = (short)(uVar32 >> 0x30);
              auVar10._8_2_ = (short)(uVar32 >> 0x20);
              auVar10._0_8_ = uVar32;
              auVar10._10_4_ = auVar8._10_4_;
              auVar21._6_8_ = 0;
              auVar21._0_6_ = auVar10._8_6_;
              auVar47._6_8_ = SUB148(auVar21 << 0x40,6);
              auVar47._4_2_ = (short)(uVar32 >> 0x10);
              auVar47._0_2_ = (ushort)uVar32;
              auVar47._2_2_ = 0;
              auVar47._14_2_ = 0;
              *(undefined1 (*) [16])&pjVar30->msg_parm = auVar47;
              uVar32 = *(ulong *)(pJVar29->quantval + uVar34 + 0xc);
              auVar7._8_4_ = 0;
              auVar7._0_8_ = uVar32;
              auVar7._12_2_ = (short)(uVar32 >> 0x30);
              auVar9._8_2_ = (short)(uVar32 >> 0x20);
              auVar9._0_8_ = uVar32;
              auVar9._10_4_ = auVar7._10_4_;
              auVar22._6_8_ = 0;
              auVar22._0_6_ = auVar9._8_6_;
              auVar48._6_8_ = SUB148(auVar22 << 0x40,6);
              auVar48._4_2_ = (short)(uVar32 >> 0x10);
              auVar48._0_2_ = (ushort)uVar32;
              auVar48._2_2_ = 0;
              auVar48._14_2_ = 0;
              *(undefined1 (*) [16])((long)&pjVar30->msg_parm + 0x10) = auVar48;
              pjVar30->msg_code = 0x5d;
              (*pjVar30->emit_message)((j_common_ptr)cinfo,2);
              uVar34 = uVar34 + 8;
            } while (uVar34 < 0x38);
          }
          lVar38 = lVar38 + (ulong)(bVar1 < 0x10) * 0x40 + -0x81;
        } while (0 < lVar38);
      }
      if (lVar38 != 0) {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0xb;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
      }
      pjVar6->next_input_byte = pbVar39;
      pjVar6->bytes_in_buffer = sVar41;
      break;
    case 0xdc:
      iVar26 = skip_variable(cinfo);
      goto LAB_0011ff01;
    case 0xdd:
      pjVar6 = cinfo->src;
      sVar41 = pjVar6->bytes_in_buffer;
      if (sVar41 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        sVar41 = pjVar6->bytes_in_buffer;
      }
      JVar3 = *pjVar6->next_input_byte;
      sVar41 = sVar41 - 1;
      if (sVar41 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        pJVar37 = pjVar6->next_input_byte;
        sVar41 = pjVar6->bytes_in_buffer;
      }
      else {
        pJVar37 = pjVar6->next_input_byte + 1;
      }
      if (CONCAT11(JVar3,*pJVar37) != 4) {
        pjVar30 = cinfo->err;
        pjVar30->msg_code = 0xb;
        (*pjVar30->error_exit)((j_common_ptr)cinfo);
      }
      sVar41 = sVar41 - 1;
      if (sVar41 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        pJVar37 = pjVar6->next_input_byte;
        sVar41 = pjVar6->bytes_in_buffer;
      }
      else {
        pJVar37 = pJVar37 + 1;
      }
      JVar3 = *pJVar37;
      sVar41 = sVar41 - 1;
      if (sVar41 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00120c43;
        pJVar37 = pjVar6->next_input_byte;
        sVar41 = pjVar6->bytes_in_buffer;
      }
      else {
        pJVar37 = pJVar37 + 1;
      }
      JVar4 = *pJVar37;
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x52;
      (pjVar30->msg_parm).i[0] = (uint)CONCAT11(JVar3,JVar4);
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      cinfo->restart_interval = (uint)CONCAT11(JVar3,JVar4);
      pjVar6->next_input_byte = pJVar37 + 1;
      pjVar6->bytes_in_buffer = sVar41 - 1;
      break;
    case 0xde:
    case 0xdf:
    case 0xf0:
    case 0xf1:
    case 0xf2:
    case 0xf3:
    case 0xf4:
    case 0xf5:
    case 0xf6:
    case 0xf7:
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfc:
    case 0xfd:
switchD_0011feec_caseD_de:
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x44;
LAB_0011ff18:
      (pjVar30->msg_parm).i[0] = iVar26;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      break;
    case 0xe0:
    case 0xe1:
    case 0xe2:
    case 0xe3:
    case 0xe4:
    case 0xe5:
    case 0xe6:
    case 0xe7:
    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xeb:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
      iVar26 = (**(code **)((long)cinfo->marker + (long)iVar26 * 8 + -0x6d0))(cinfo);
      goto LAB_0011ff01;
    case 0xfe:
      iVar26 = (*cinfo->marker[1].reset_marker_reader)(cinfo);
LAB_0011ff01:
      if (iVar26 == 0) goto LAB_00120c43;
      break;
    default:
      if (iVar26 != 1) goto switchD_0011feec_caseD_de;
switchD_0011feec_caseD_d0:
      pjVar30 = cinfo->err;
      pjVar30->msg_code = 0x5c;
      (pjVar30->msg_parm).i[0] = iVar26;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    }
    cinfo->unread_marker = 0;
  } while( true );
LAB_00120a01:
  do {
    if (local_190 == 0) {
      bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar25 == 0) goto LAB_00120c43;
      pbVar36 = pjVar6->next_input_byte;
      local_190 = pjVar6->bytes_in_buffer;
    }
    bVar2 = *pbVar36;
    local_190 = local_190 - 1;
    if (local_190 == 0) {
      bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar25 == 0) goto LAB_00120c43;
      pbVar36 = pjVar6->next_input_byte;
      local_190 = pjVar6->bytes_in_buffer;
    }
    else {
      pbVar36 = pbVar36 + 1;
    }
    bVar5 = *pbVar36;
    pjVar42 = cinfo->comp_info;
    uVar33 = (uint)bVar2;
    if (0 < cinfo->num_components) {
      uVar27 = cinfo->num_components - 1;
      if (2 < uVar27) {
        uVar27 = 3;
      }
      uVar32 = 0;
      do {
        if ((pjVar42->component_id == uVar33) &&
           (cinfo->cur_comp_info[uVar32] == (jpeg_component_info *)0x0)) goto LAB_00120aa7;
        uVar32 = uVar32 + 1;
        pjVar42 = pjVar42 + 1;
      } while (uVar27 + 1 != uVar32);
    }
    pjVar30 = cinfo->err;
    pjVar30->msg_code = 5;
    (pjVar30->msg_parm).i[0] = uVar33;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_00120aa7:
    cinfo->cur_comp_info[uVar34] = pjVar42;
    pjVar42->dc_tbl_no = (uint)(bVar5 >> 4);
    pjVar42->ac_tbl_no = bVar5 & 0xf;
    pjVar30 = cinfo->err;
    (pjVar30->msg_parm).i[0] = uVar33;
    (pjVar30->msg_parm).i[1] = pjVar42->dc_tbl_no;
    (pjVar30->msg_parm).i[2] = pjVar42->ac_tbl_no;
    pjVar30->msg_code = 0x68;
    (*pjVar30->emit_message)((j_common_ptr)cinfo,1);
    if (uVar34 != 0) {
      uVar32 = 0;
      do {
        if (cinfo->cur_comp_info[uVar32] == pjVar42) {
          pjVar30 = cinfo->err;
          pjVar30->msg_code = 5;
          (pjVar30->msg_parm).i[0] = uVar33;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        uVar32 = uVar32 + 1;
      } while (uVar34 != uVar32);
    }
    uVar34 = uVar34 + 1;
    pbVar36 = pbVar36 + 1;
    local_190 = local_190 - 1;
  } while (uVar34 != (uint)bVar1);
LAB_00120b43:
  if (local_190 == 0) {
    bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
    if (bVar25 != 0) {
      pbVar36 = pjVar6->next_input_byte;
      local_190 = pjVar6->bytes_in_buffer;
      goto LAB_00120b61;
    }
LAB_00120c43:
    iVar26 = 0;
  }
  else {
LAB_00120b61:
    cinfo->Ss = (uint)*pbVar36;
    local_190 = local_190 - 1;
    if (local_190 == 0) {
      bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar25 == 0) goto LAB_00120c43;
      pbVar36 = pjVar6->next_input_byte;
      local_190 = pjVar6->bytes_in_buffer;
    }
    else {
      pbVar36 = pbVar36 + 1;
    }
    cinfo->Se = (uint)*pbVar36;
    local_190 = local_190 - 1;
    if (local_190 == 0) {
      bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar25 == 0) goto LAB_00120c43;
      pbVar36 = pjVar6->next_input_byte;
      local_190 = pjVar6->bytes_in_buffer;
    }
    else {
      pbVar36 = pbVar36 + 1;
    }
    bVar1 = *pbVar36;
    cinfo->Ah = (uint)(bVar1 >> 4);
    cinfo->Al = bVar1 & 0xf;
    pjVar30 = cinfo->err;
    (pjVar30->msg_parm).i[0] = cinfo->Ss;
    (pjVar30->msg_parm).i[1] = cinfo->Se;
    (pjVar30->msg_parm).i[2] = cinfo->Ah;
    (pjVar30->msg_parm).i[3] = cinfo->Al;
    pjVar30->msg_code = 0x69;
    iVar26 = 1;
    (*pjVar30->emit_message)((j_common_ptr)cinfo,1);
    cinfo->marker->next_restart_num = 0;
    cinfo->input_scan_number = cinfo->input_scan_number + 1;
    pjVar6->next_input_byte = pbVar36 + 1;
    pjVar6->bytes_in_buffer = local_190 - 1;
    cinfo->unread_marker = 0;
  }
  return iVar26;
}

Assistant:

METHODDEF(int)
read_markers(j_decompress_ptr cinfo)
{
  /* Outer loop repeats once for each marker. */
  for (;;) {
    /* Collect the marker proper, unless we already did. */
    /* NB: first_marker() enforces the requirement that SOI appear first. */
    if (cinfo->unread_marker == 0) {
      if (!cinfo->marker->saw_SOI) {
        if (!first_marker(cinfo))
          return JPEG_SUSPENDED;
      } else {
        if (!next_marker(cinfo))
          return JPEG_SUSPENDED;
      }
    }
    /* At this point cinfo->unread_marker contains the marker code and the
     * input point is just past the marker proper, but before any parameters.
     * A suspension will cause us to return with this state still true.
     */
    switch (cinfo->unread_marker) {
    case M_SOI:
      if (!get_soi(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_SOF0:                /* Baseline */
    case M_SOF1:                /* Extended sequential, Huffman */
      if (!get_sof(cinfo, FALSE, FALSE))
        return JPEG_SUSPENDED;
      break;

    case M_SOF2:                /* Progressive, Huffman */
      if (!get_sof(cinfo, TRUE, FALSE))
        return JPEG_SUSPENDED;
      break;

    case M_SOF9:                /* Extended sequential, arithmetic */
      if (!get_sof(cinfo, FALSE, TRUE))
        return JPEG_SUSPENDED;
      break;

    case M_SOF10:               /* Progressive, arithmetic */
      if (!get_sof(cinfo, TRUE, TRUE))
        return JPEG_SUSPENDED;
      break;

    /* Currently unsupported SOFn types */
    case M_SOF3:                /* Lossless, Huffman */
    case M_SOF5:                /* Differential sequential, Huffman */
    case M_SOF6:                /* Differential progressive, Huffman */
    case M_SOF7:                /* Differential lossless, Huffman */
    case M_JPG:                 /* Reserved for JPEG extensions */
    case M_SOF11:               /* Lossless, arithmetic */
    case M_SOF13:               /* Differential sequential, arithmetic */
    case M_SOF14:               /* Differential progressive, arithmetic */
    case M_SOF15:               /* Differential lossless, arithmetic */
      ERREXIT1(cinfo, JERR_SOF_UNSUPPORTED, cinfo->unread_marker);
      break;

    case M_SOS:
      if (!get_sos(cinfo))
        return JPEG_SUSPENDED;
      cinfo->unread_marker = 0; /* processed the marker */
      return JPEG_REACHED_SOS;

    case M_EOI:
      TRACEMS(cinfo, 1, JTRC_EOI);
      cinfo->unread_marker = 0; /* processed the marker */
      return JPEG_REACHED_EOI;

    case M_DAC:
      if (!get_dac(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_DHT:
      if (!get_dht(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_DQT:
      if (!get_dqt(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_DRI:
      if (!get_dri(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_APP0:
    case M_APP1:
    case M_APP2:
    case M_APP3:
    case M_APP4:
    case M_APP5:
    case M_APP6:
    case M_APP7:
    case M_APP8:
    case M_APP9:
    case M_APP10:
    case M_APP11:
    case M_APP12:
    case M_APP13:
    case M_APP14:
    case M_APP15:
      if (!(*((my_marker_ptr)cinfo->marker)->process_APPn[
               cinfo->unread_marker - (int)M_APP0]) (cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_COM:
      if (!(*((my_marker_ptr)cinfo->marker)->process_COM) (cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_RST0:                /* these are all parameterless */
    case M_RST1:
    case M_RST2:
    case M_RST3:
    case M_RST4:
    case M_RST5:
    case M_RST6:
    case M_RST7:
    case M_TEM:
      TRACEMS1(cinfo, 1, JTRC_PARMLESS_MARKER, cinfo->unread_marker);
      break;

    case M_DNL:                 /* Ignore DNL ... perhaps the wrong thing */
      if (!skip_variable(cinfo))
        return JPEG_SUSPENDED;
      break;

    default:                    /* must be DHP, EXP, JPGn, or RESn */
      /* For now, we treat the reserved markers as fatal errors since they are
       * likely to be used to signal incompatible JPEG Part 3 extensions.
       * Once the JPEG 3 version-number marker is well defined, this code
       * ought to change!
       */
      ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
      break;
    }
    /* Successfully processed marker, so reset state variable */
    cinfo->unread_marker = 0;
  } /* end loop */
}